

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O1

PropertyQueryFlags __thiscall
Js::JavascriptProxy::HasPropertyQuery
          (JavascriptProxy *this,PropertyId propertyId,PropertyValueInfo *info)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  bool bVar3;
  BOOL BVar4;
  Attributes attributes;
  BOOL BVar5;
  int iVar6;
  HostScriptContext *pHVar7;
  Var pvVar8;
  JavascriptFunction *function;
  JavascriptMethod p_Var9;
  RecyclableObject *ptr;
  RecyclableObject *obj;
  PropertyDescriptor local_78;
  Var local_48;
  RecyclableObject *local_40;
  PropertyId local_38;
  bool local_31;
  
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = (RecyclableObject *)this;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
    *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag | disablePrototypeCacheFlag;
  }
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  BVar4 = 0;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  this_00 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_External;
    goto LAB_00d073db;
  }
  local_38 = propertyId;
  pHVar7 = ThreadContext::GetPreviousHostScriptContext(this_00);
  pSVar2 = pHVar7->scriptContext;
  BVar4 = 0;
  pvVar8 = CrossSite::MarshalVar(pSVar2,(this->handler).ptr,false);
  if (pvVar8 == (Var)0x0) {
    bVar3 = ThreadContext::RecordImplicitException(this_00);
    if (bVar3) {
      JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea15,L"has");
    }
    goto LAB_00d073db;
  }
  local_40 = (RecyclableObject *)CrossSite::MarshalVar(pSVar2,(this->target).ptr,false);
  function = GetMethodHelper(this,0xb4,pSVar2);
  if ((function == (JavascriptFunction *)0x0) ||
     (bVar3 = Memory::Recycler::IsHeapEnumInProgress(pSVar2->recycler), bVar3)) {
    BVar4 = JavascriptOperators::HasProperty(local_40,local_38);
    goto LAB_00d073db;
  }
  local_48 = GetName(pSVar2,local_38);
  local_31 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar3 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar3) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    obj = local_40;
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var9);
    p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var9)((RecyclableObject *)function,(CallInfo)function,0x2000003,0,0,0,0,0x2000003,
                    pvVar8,obj,local_48);
    bVar3 = ThreadContext::IsOnStack(ptr);
LAB_00d072ac:
    if (bVar3 != false) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
    }
  }
  else if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
      obj = local_40;
      if (this_00->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      CheckIsExecutable((RecyclableObject *)function,p_Var9);
      p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      ptr = (RecyclableObject *)
            (*p_Var9)((RecyclableObject *)function,(CallInfo)function,0x2000003,0,0,0,0,0x2000003,
                      pvVar8,obj,local_48);
      bVar3 = ThreadContext::IsOnStack(ptr);
      goto LAB_00d072ac;
    }
    IVar1 = this_00->implicitCallFlags;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var9);
    p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var9)((RecyclableObject *)function,(CallInfo)function,0x2000003,0,0,0,0,0x2000003,
                    pvVar8,local_40,local_48);
    this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
    obj = local_40;
  }
  else {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
    ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
            super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue
          .ptr;
    obj = local_40;
  }
  this_00->reentrancySafeOrHandled = local_31;
  BVar4 = JavascriptConversion::ToBoolean(ptr,pSVar2);
  if (BVar4 == 0) {
    PropertyDescriptor::PropertyDescriptor(&local_78);
    BVar5 = JavascriptOperators::GetOwnPropertyDescriptor(obj,local_38,pSVar2,&local_78);
    if ((BVar5 != 0) &&
       ((bVar3 = PropertyDescriptor::IsConfigurable(&local_78), !bVar3 ||
        (iVar6 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[0x33])(obj), iVar6 == 0)))) {
      JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea14,L"has");
    }
  }
LAB_00d073db:
  return (PropertyQueryFlags)(BVar4 != 0);
}

Assistant:

PropertyQueryFlags JavascriptProxy::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        if (info)
        {
            // Prevent caching. See comment in GetPropertyQuery for more detail.
            PropertyValueInfo::SetNoCache(info, this);
            PropertyValueInfo::DisablePrototypeCache(info, this);
        }
        auto fn = [&](RecyclableObject* object)->BOOL {
            return JavascriptOperators::HasProperty(object, propertyId);
        };
        auto getPropertyId = [&]() ->PropertyId {
            return propertyId;
        };
        return JavascriptConversion::BooleanToPropertyQueryFlags(HasPropertyTrap(fn, getPropertyId));
    }